

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

STRING_HANDLE encode_url_data(char *text)

{
  uchar uVar1;
  size_t sVar2;
  char *memory;
  LOGGER_LOG p_Var3;
  char *local_60;
  LOGGER_LOG l_1;
  size_t currentEncodePosition;
  LOGGER_LOG l;
  char *iterator;
  uchar currentUnsignedChar;
  char *encodedURL;
  size_t lengthOfResult;
  STRING_HANDLE result;
  char *text_local;
  
  encodedURL = (char *)0x0;
  l = (LOGGER_LOG)text;
  do {
    uVar1 = (uchar)*l;
    sVar2 = URL_PrintableCharSize(uVar1);
    if (encodedURL < (char *)(-sVar2 - 1)) {
      sVar2 = URL_PrintableCharSize(uVar1);
      local_60 = encodedURL + sVar2;
    }
    else {
      local_60 = (char *)0xffffffffffffffff;
    }
    encodedURL = local_60;
    l = l + 1;
  } while (uVar1 != '\0');
  if ((local_60 == (char *)0xffffffffffffffff) ||
     (memory = (char *)malloc((size_t)local_60), memory == (char *)0x0)) {
    lengthOfResult = 0;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                ,"encode_url_data",0xf2,1,"URL_Encode:: MALLOC failure on encode. size=%zu",local_60
               );
    }
  }
  else {
    l_1 = (LOGGER_LOG)0x0;
    l = (LOGGER_LOG)text;
    do {
      uVar1 = (uchar)*l;
      sVar2 = URL_PrintableChar(uVar1,memory + (long)l_1);
      l_1 = l_1 + sVar2;
      l = l + 1;
    } while (uVar1 != '\0');
    lengthOfResult = (size_t)STRING_new_with_memory(memory);
    if ((STRING_HANDLE)lengthOfResult == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                  ,"encode_url_data",0x101,1,"URL_Encode:: MALLOC failure on encode.");
      }
      free(memory);
    }
  }
  return (STRING_HANDLE)lengthOfResult;
}

Assistant:

static STRING_HANDLE encode_url_data(const char* text)
{
    STRING_HANDLE result;
    size_t lengthOfResult = 0;
    char* encodedURL;
    unsigned char currentUnsignedChar;
    const char* iterator = text;

    /*Codes_SRS_URL_ENCODE_06_003: [If input is a zero length string then URL_Encode will return a zero length string.]*/
    do
    {
        currentUnsignedChar = (unsigned char)(*iterator++);
        lengthOfResult = safe_add_size_t(lengthOfResult, URL_PrintableCharSize(currentUnsignedChar));
    } while (currentUnsignedChar != 0);

    if (lengthOfResult == SIZE_MAX ||
        (encodedURL = (char*)malloc(lengthOfResult)) == NULL)
    {
        /*Codes_SRS_URL_ENCODE_06_002: [If an error occurs during the encoding of input then URL_Encode will return NULL.]*/
        result = NULL;
        LogError("URL_Encode:: MALLOC failure on encode. size=%zu", lengthOfResult);
    }
    else
    {
        size_t currentEncodePosition = 0;
        iterator = text;;
        do
        {
            currentUnsignedChar = (unsigned char)(*iterator++);
            currentEncodePosition += URL_PrintableChar(currentUnsignedChar, &encodedURL[currentEncodePosition]);
        } while (currentUnsignedChar != 0);

        result = STRING_new_with_memory(encodedURL);
        if (result == NULL)
        {
            LogError("URL_Encode:: MALLOC failure on encode.");
            free(encodedURL);
        }
    }
    return result;
}